

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

_Bool ecs_get_info(ecs_world_t *world,ecs_entity_t entity,ecs_entity_info_t *info)

{
  ecs_record_t *record_00;
  ecs_record_t *record;
  ecs_entity_info_t *info_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  info->table = (ecs_table_t *)0x0;
  info->record = (ecs_record_t *)0x0;
  info->data = (ecs_data_t *)0x0;
  info->is_watched = false;
  if ((entity & 0x8000000000000000) == 0) {
    record_00 = (ecs_record_t *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,entity);
    if (record_00 == (ecs_record_t *)0x0) {
      world_local._7_1_ = false;
    }
    else {
      set_info_from_record(entity,info,record_00);
      world_local._7_1_ = true;
    }
  }
  else {
    world_local._7_1_ = false;
  }
  return world_local._7_1_;
}

Assistant:

bool ecs_get_info(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entity_info_t * info)
{
    info->table = NULL;
    info->record = NULL;
    info->data = NULL;
    info->is_watched = false;

    if (entity & ECS_ROLE) {
        return false;
    }
    
    ecs_record_t *record = ecs_eis_get(world, entity);

    if (!record) {
        return false;
    }

    set_info_from_record(entity, info, record);

    return true;
}